

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

UtcTimeOnly * FIX::UtcTimeOnlyConvertor::convert(UtcTimeOnly *__return_storage_ptr__,string *value)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  FieldConvertError *this;
  int second;
  long lVar4;
  int minute;
  int hour;
  size_type sVar5;
  int fraction;
  
  sVar2 = value->_M_string_length;
  if (sVar2 - 0x13 < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    pcVar3 = (value->_M_dataplus)._M_p;
    lVar4 = 0;
    do {
      if (lVar4 == 2) {
        if (pcVar3[2] != ':') {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
          goto LAB_00178c63;
        }
        lVar4 = 3;
        goto LAB_00178b0a;
      }
      pcVar1 = pcVar3 + lVar4;
      lVar4 = lVar4 + 1;
    } while ((int)*pcVar1 - 0x30U < 10);
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  goto LAB_00178c63;
  while (pcVar1 = pcVar3 + lVar4, lVar4 = lVar4 + 1, (int)*pcVar1 - 0x30U < 10) {
LAB_00178b0a:
    if (lVar4 == 5) {
      if (pcVar3[5] != ':') {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_00178c63;
      }
      lVar4 = 6;
      goto LAB_00178b47;
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  goto LAB_00178c63;
  while (pcVar1 = pcVar3 + lVar4, lVar4 = lVar4 + 1, (int)*pcVar1 - 0x30U < 10) {
LAB_00178b47:
    if (lVar4 == 8) {
      if (*pcVar3 * 10 + (int)pcVar3[1] + -0x1e0 < 0x48) {
        if (pcVar3[3] * 10 + (int)pcVar3[4] + -0x1e0 < 0x6c) {
          if (pcVar3[6] * 10 + (int)pcVar3[7] + -0x1e0 < 0x6d) {
            hour = *pcVar3 * 10 + (int)pcVar3[1] + -0x210;
            minute = pcVar3[3] * 10 + (int)pcVar3[4] + -0x210;
            second = pcVar3[6] * 10 + (int)pcVar3[7] + -0x210;
            if (sVar2 == 8) {
              UtcTimeOnly::UtcTimeOnly(__return_storage_ptr__,hour,minute,second,0);
              return __return_storage_ptr__;
            }
            if (pcVar3[8] == '.') {
              fraction = 0;
              sVar5 = 9;
              while( true ) {
                if (sVar2 == sVar5) {
                  UtcTimeOnly::UtcTimeOnly
                            (__return_storage_ptr__,hour,minute,second,fraction,(int)sVar2 + -9);
                  return __return_storage_ptr__;
                }
                if (9 < (int)pcVar3[sVar5] - 0x30U) break;
                fraction = fraction * 10 + (int)pcVar3[sVar5] + -0x30;
                sVar5 = sVar5 + 1;
              }
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
            else {
              this = (FieldConvertError *)__cxa_allocate_exception(0x50);
              FieldConvertError::FieldConvertError(this,value);
            }
          }
          else {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
        }
        else {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
      }
      else {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
      goto LAB_00178c63;
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
LAB_00178c63:
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    size_t length = value.size();
    if (length < 8 || length > 18) {
      throw FieldConvertError(value);
    }

    size_t i = 0;
    int c = 0;
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }
    if (value[i++] != ':') {
      throw FieldConvertError(value);
    }
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }
    if (value[i++] != ':') {
      throw FieldConvertError(value);
    }
    for (c = 0; c < 2; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int hour, min, sec;

    i = 0;

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if (23 < hour) {
      throw FieldConvertError(value);
    }

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if (59 < min) {
      throw FieldConvertError(value);
    }

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if (60 < sec) {
      throw FieldConvertError(value);
    }

    if (length == 8) {
      return UtcTimeOnly(hour, min, sec, 0);
    }

    if (value[i++] != '.') {
      throw FieldConvertError(value);
    }

    int fraction = 0;
    for (; i < length; ++i) {
      char ch = value[i];
      if (!IS_DIGIT(ch)) {
        throw FieldConvertError(value);
      }
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeOnly(hour, min, sec, fraction, static_cast<int>(length - 8 - 1));
  }